

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.cpp
# Opt level: O0

int mbedtls_pk_parse_subpubkey(uchar **p,uchar *end,mbedtls_pk_context *pk)

{
  int iVar1;
  uchar *puVar2;
  mbedtls_pk_info_t *pmVar3;
  long *in_RDI;
  mbedtls_pk_info_t *pk_info;
  int ec_grp_id;
  mbedtls_pk_type_t pk_alg;
  mbedtls_asn1_buf alg_params;
  size_t len;
  int ret;
  mbedtls_pk_context *in_stack_ffffffffffffff98;
  uchar *in_stack_ffffffffffffffa0;
  uchar **in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb8;
  mbedtls_asn1_buf *in_stack_ffffffffffffffc0;
  mbedtls_pk_type_t *in_stack_ffffffffffffffc8;
  uchar *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  int local_4;
  
  iVar1 = mbedtls_asn1_get_tag
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     (size_t *)in_stack_ffffffffffffff98,0);
  if (iVar1 == 0) {
    puVar2 = in_stack_ffffffffffffffd0 + *in_RDI;
    local_4 = pk_get_pk_alg((uchar **)(ulong)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                            in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            in_stack_ffffffffffffffb8);
    if (local_4 == 0) {
      iVar1 = mbedtls_asn1_get_bitstring_null
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                         (size_t *)in_stack_ffffffffffffff98);
      if (iVar1 == 0) {
        if (in_stack_ffffffffffffffd0 + *in_RDI == puVar2) {
          pmVar3 = mbedtls_pk_info_from_type(MBEDTLS_PK_NONE);
          if (pmVar3 == (mbedtls_pk_info_t *)0x0) {
            local_4 = -0x3c80;
          }
          else {
            local_4 = mbedtls_pk_setup(in_stack_ffffffffffffff98,(mbedtls_pk_info_t *)0x87f9be);
            if (local_4 == 0) {
              local_4 = -0x3c80;
              mbedtls_pk_free((mbedtls_pk_context *)0x87fad2);
            }
          }
        }
        else {
          local_4 = mbedtls_error_add(-0x3b00,-0x66,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/third_party/mbedtls/library/pkparse.cpp"
                                      ,0x220);
        }
      }
      else {
        local_4 = mbedtls_error_add(-0x3b00,iVar1,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/third_party/mbedtls/library/pkparse.cpp"
                                    ,0x21b);
      }
    }
  }
  else {
    local_4 = mbedtls_error_add(-0x3d00,iVar1,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/third_party/mbedtls/library/pkparse.cpp"
                                ,0x211);
  }
  return local_4;
}

Assistant:

int mbedtls_pk_parse_subpubkey(unsigned char **p, const unsigned char *end,
                               mbedtls_pk_context *pk)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;
    mbedtls_asn1_buf alg_params;
    mbedtls_pk_type_t pk_alg = MBEDTLS_PK_NONE;
    int ec_grp_id = 0;
    const mbedtls_pk_info_t *pk_info;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }

    end = *p + len;

    if ((ret = pk_get_pk_alg(p, end, &pk_alg, &alg_params, &ec_grp_id)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_asn1_get_bitstring_null(p, end, &len)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_INVALID_PUBKEY, ret);
    }

    if (*p + len != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_INVALID_PUBKEY,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    if ((pk_info = mbedtls_pk_info_from_type(pk_alg)) == NULL) {
        return MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;
    }

    if ((ret = mbedtls_pk_setup(pk, pk_info)) != 0) {
        return ret;
    }

#if defined(MBEDTLS_RSA_C)
    if (pk_alg == MBEDTLS_PK_RSA) {
        ret = mbedtls_rsa_parse_pubkey(mbedtls_pk_rsa(*pk), *p, (size_t) (end - *p));
        if (ret == 0) {
            /* On success all the input has been consumed by the parsing function. */
            *p += end - *p;
        } else if ((ret <= MBEDTLS_ERR_ASN1_OUT_OF_DATA) &&
                   (ret >= MBEDTLS_ERR_ASN1_BUF_TOO_SMALL)) {
            /* In case of ASN1 error codes add MBEDTLS_ERR_PK_INVALID_PUBKEY. */
            ret = MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_INVALID_PUBKEY, ret);
        } else {
            ret = MBEDTLS_ERR_PK_INVALID_PUBKEY;
        }
    } else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_PK_HAVE_ECC_KEYS)
    if (pk_alg == MBEDTLS_PK_ECKEY_DH || pk_alg == MBEDTLS_PK_ECKEY) {
#if defined(MBEDTLS_PK_HAVE_RFC8410_CURVES)
        if (MBEDTLS_PK_IS_RFC8410_GROUP_ID(ec_grp_id)) {
            ret = pk_use_ecparams_rfc8410(&alg_params, ec_grp_id, pk);
        } else
#endif
        {
            ret = pk_use_ecparams(&alg_params, pk);
        }
        if (ret == 0) {
            ret = mbedtls_pk_ecc_set_pubkey(pk, *p, (size_t) (end - *p));
            *p += end - *p;
        }
    } else
#endif /* MBEDTLS_PK_HAVE_ECC_KEYS */
    ret = MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;

    if (ret == 0 && *p != end) {
        ret = MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_INVALID_PUBKEY,
                                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    if (ret != 0) {
        mbedtls_pk_free(pk);
    }

    return ret;
}